

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# go_construct.cc
# Opt level: O3

void __thiscall re2c::Cases::add(Cases *this,uint32_t lb,uint32_t ub,State *to)

{
  uint uVar1;
  Case *this_00;
  ulong uVar2;
  ulong uVar3;
  pair<unsigned_int,_unsigned_int> local_18;
  
  uVar2 = (ulong)this->cases_size;
  this_00 = this->cases;
  uVar3 = uVar2;
  if (uVar2 == 0) {
    uVar2 = 0;
  }
  else {
    do {
      if (this_00->to == to) {
        local_18.second = ub;
        local_18.first = lb;
        std::
        vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
        ::emplace_back<std::pair<unsigned_int,unsigned_int>>
                  ((vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
                    *)this_00,&local_18);
        return;
      }
      uVar3 = uVar3 - 1;
      this_00 = this_00 + 1;
    } while (uVar3 != 0);
  }
  local_18.second = ub;
  local_18.first = lb;
  std::
  vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
  ::emplace_back<std::pair<unsigned_int,unsigned_int>>
            ((vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
              *)(this->cases + uVar2),&local_18);
  uVar1 = this->cases_size;
  this->cases[uVar1].to = to;
  this->cases_size = uVar1 + 1;
  return;
}

Assistant:

void Cases::add (uint32_t lb, uint32_t ub, State * to)
{
	for (uint32_t i = 0; i < cases_size; ++i)
	{
		if (cases[i].to == to)
		{
			cases[i].ranges.push_back (std::make_pair (lb, ub));
			return;
		}
	}
	cases[cases_size].ranges.push_back (std::make_pair (lb, ub));
	cases[cases_size].to = to;
	++cases_size;
}